

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImDrawList *draw_list,ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,
               ImVec2 grid_off,float rounding,int rounding_corners_flags)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ImU32 IVar4;
  ImU32 IVar5;
  uint uVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  undefined1 in_register_00001208 [56];
  undefined1 in_register_00001248 [56];
  undefined8 in_XMM3_Qb;
  undefined1 auVar9 [64];
  float fVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float fVar15;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar11._8_56_ = in_register_00001248;
  auVar11._0_8_ = p_max;
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = p_min;
  local_88 = auVar9._0_16_;
  local_c0 = (ImVec2)vmovlps_avx(local_88);
  local_78 = auVar11._0_16_;
  local_c8 = (ImVec2)vmovlps_avx(local_78);
  if (col < 0xff000000) {
    local_98 = vmovshdup_avx(local_78);
    local_a8 = grid_off;
    uStack_a0 = in_XMM3_Qb;
    IVar4 = ImAlphaBlendColors(0xffcccccc,col);
    IVar4 = GetColorU32(IVar4);
    IVar5 = ImAlphaBlendColors(0xff808080,col);
    IVar5 = GetColorU32(IVar5);
    ImDrawList::AddRectFilled(draw_list,&local_c0,&local_c8,IVar4,rounding,rounding_corners_flags);
    auVar12 = ZEXT1664(local_98);
    auVar11 = ZEXT1664(local_88);
    auVar9 = ZEXT1664(local_78);
    auVar8._0_4_ = local_a8.x + local_88._0_4_;
    auVar8._4_4_ = local_a8.y + local_88._4_4_;
    auVar8._8_4_ = (float)uStack_a0 + local_88._8_4_;
    auVar8._12_4_ = uStack_a0._4_4_ + local_88._12_4_;
    local_58 = vmovshdup_avx(auVar8);
    if (local_58._0_4_ < local_98._0_4_) {
      local_68 = vmovshdup_avx(local_88);
      fVar1 = local_a8.x + local_88._0_4_;
      bVar7 = 0;
      do {
        auVar2 = vminss_avx(auVar12._0_16_,local_58);
        auVar8 = vcmpss_avx(local_58,local_68,1);
        local_48 = vblendvps_avx(auVar2,local_68,auVar8);
        auVar14 = ZEXT1664(local_48);
        local_58 = ZEXT416((uint)(local_58._0_4_ + grid_step));
        auVar8 = vminss_avx(local_58,auVar12._0_16_);
        auVar13 = ZEXT1664(auVar8);
        if ((local_48._0_4_ < auVar8._0_4_) &&
           (fVar15 = (float)bVar7 * grid_step + fVar1, fVar15 < auVar9._0_4_)) {
          do {
            auVar3 = vminss_avx(auVar9._0_16_,ZEXT416((uint)fVar15));
            auVar2 = vcmpss_avx(ZEXT416((uint)fVar15),auVar11._0_16_,1);
            auVar2 = vblendvps_avx(auVar3,auVar11._0_16_,auVar2);
            auVar3 = vminss_avx(ZEXT416((uint)(fVar15 + grid_step)),auVar9._0_16_);
            local_b0.x = auVar2._0_4_;
            local_b8.x = auVar3._0_4_;
            if (local_b0.x < local_b8.x) {
              uVar6 = 0;
              local_b0.y = auVar14._0_4_;
              fVar10 = auVar11._0_4_;
              if (local_b0.y <= (float)local_68._0_4_) {
                uVar6 = (uint)(local_b0.x <= fVar10);
                if (auVar9._0_4_ <= local_b8.x) {
                  uVar6 = local_b0.x <= fVar10 | 2;
                }
              }
              local_b8.y = auVar13._0_4_;
              if (auVar12._0_4_ <= local_b8.y) {
                if (local_b0.x <= fVar10) {
                  uVar6 = uVar6 + 4;
                }
                if (auVar9._0_4_ <= local_b8.x) {
                  uVar6 = uVar6 | 8;
                }
              }
              local_a8.x = fVar15;
              fVar15 = 0.0;
              if ((uVar6 & rounding_corners_flags) != 0) {
                fVar15 = rounding;
              }
              ImDrawList::AddRectFilled
                        (draw_list,&local_b0,&local_b8,IVar5,fVar15,uVar6 & rounding_corners_flags);
              auVar9 = ZEXT1664(local_78);
              auVar11 = ZEXT1664(local_88);
              auVar12 = ZEXT1664(local_98);
              auVar14 = ZEXT1664(local_48);
              auVar13 = ZEXT464((uint)auVar8._0_4_);
              fVar15 = local_a8.x;
            }
            fVar15 = fVar15 + grid_step + grid_step;
          } while (fVar15 < auVar9._0_4_);
        }
        bVar7 = bVar7 ^ 1;
      } while (local_58._0_4_ < auVar12._0_4_);
    }
  }
  else {
    ImDrawList::AddRectFilled(draw_list,&local_c0,&local_c8,col,rounding,rounding_corners_flags);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImDrawList* draw_list, ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, int rounding_corners_flags)
{
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = ImGui::GetColorU32(ImAlphaBlendColors(IM_COL32(204, 204, 204, 255), col));
        ImU32 col_bg2 = ImGui::GetColorU32(ImAlphaBlendColors(IM_COL32(128, 128, 128, 255), col));
        draw_list->AddRectFilled(p_min, p_max, col_bg1, rounding, rounding_corners_flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                int rounding_corners_flags_cell = 0;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotRight; }
                rounding_corners_flags_cell &= rounding_corners_flags;
                draw_list->AddRectFilled(ImVec2(x1, y1), ImVec2(x2, y2), col_bg2, rounding_corners_flags_cell ? rounding : 0.0f, rounding_corners_flags_cell);
            }
        }
    }
    else
    {
        draw_list->AddRectFilled(p_min, p_max, col, rounding, rounding_corners_flags);
    }
}